

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void __thiscall
Centaurus::LDFARoutineEM64T<char>::LDFARoutineEM64T
          (LDFARoutineEM64T<char> *this,LookaheadDFA<char> *ldfa,Logger *logger)

{
  uint uVar1;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels_00;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  long lVar2;
  uint uVar3;
  CodeHolder *pCVar4;
  bool bVar5;
  Label LVar6;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  Label finishlabel;
  Label rejectlabel;
  undefined1 local_f8 [16];
  X86Assembler as;
  
  this->_vptr_LDFARoutineEM64T = (_func_int **)&PTR__LDFARoutineEM64T_0019f798;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  pCVar4 = &this->m_code;
  asmjit::CodeHolder::CodeHolder(pCVar4);
  asmjit::CodeHolder::init
            (pCVar4,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(pCVar4,logger);
  }
  asmjit::X86Assembler::X86Assembler(&as,pCVar4);
  emit_parser_prolog(&as);
  exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000032;
  exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x400000020;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
             (Operand_ *)&exitlabels);
  asmjit::Assembler::newLabel((Assembler *)&rejectlabel);
  exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = LookaheadDFA<char>::get_color_num(ldfa);
  uVar1 = ~((int)uVar1 >> 0x1f) & uVar1;
  uVar3 = uVar1;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    asmjit::Assembler::newLabel((Assembler *)&finishlabel);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::emplace_back<asmjit::Label>
              (&exitlabels,&finishlabel);
  }
  exitlabels_00 = &exitlabels;
  emit(&as,&rejectlabel,ldfa,exitlabels_00);
  asmjit::CodeEmitter::emit((CodeEmitter *)&as,0x11e,(Operand_ *)&rejectlabel);
  LVar6 = asmjit::Assembler::newLabel((Assembler *)&finishlabel);
  __addr = LVar6.super_Operand.super_Operand_.field_0._8_8_;
  pCVar4 = (CodeHolder *)0x1;
  for (lVar2 = 0; (ulong)uVar1 << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    asmjit::Assembler::bind
              (&as.super_Assembler,
               (int)exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start + (int)lVar2,__addr,
               (socklen_t)exitlabels_00);
    local_f8._0_8_ = (CodeEmitter *)0x3;
    exitlabels_00 = (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_f8;
    local_f8._8_8_ = pCVar4;
    asmjit::CodeEmitter::emit
              (&as.super_Assembler.super_CodeEmitter,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
               (Operand_ *)exitlabels_00);
    pCVar4 = (CodeHolder *)((long)&(pCVar4->_codeInfo)._archInfo.field_0 + 1);
    asmjit::CodeEmitter::emit(&as.super_Assembler.super_CodeEmitter,0x11e,(Operand_ *)&finishlabel);
    __addr = extraout_RDX;
  }
  asmjit::Assembler::bind(&as.super_Assembler,(int)&finishlabel,__addr,(socklen_t)exitlabels_00);
  emit_parser_epilog(&as,&rejectlabel);
  asmjit::CodeEmitter::finalize((CodeEmitter *)&as);
  std::_Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>::~_Vector_base
            (&exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
  asmjit::X86Assembler::~X86Assembler(&as);
  return;
}

Assistant:

LDFARoutineEM64T<TCHAR>::LDFARoutineEM64T(const LookaheadDFA<TCHAR>& ldfa, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    asmjit::Label rejectlabel = as.newLabel();

    std::vector<asmjit::Label> exitlabels;

    int decision_num = ldfa.get_color_num();
    for (int i = 0; i < decision_num; i++)
    {
        exitlabels.push_back(as.newLabel());
    }

    emit(as, rejectlabel, ldfa, exitlabels);
    as.jmp(rejectlabel);

    asmjit::Label finishlabel = as.newLabel();
    for (int i = 0; i < decision_num; i++)
    {
        as.bind(exitlabels[i]);
        as.mov(INPUT_REG, asmjit::Imm(i + 1));
        as.jmp(finishlabel);
    }

    as.bind(finishlabel);
    emit_parser_epilog(as, rejectlabel);
   
    as.finalize();
}